

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all-to-all.hpp
# Opt level: O0

void __thiscall
diy::detail::AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)>::AllToAllReduce
          (AllToAllReduce<void_(*)(void_*,_const_diy::ReduceProxy_&)> *this,
          _func_void_void_ptr_ReduceProxy_ptr **op_,Assigner *assigner)

{
  int iVar1;
  Assigner *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  BlockID nbr;
  int gid;
  BlockID *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar2;
  BlockID local_24;
  int local_1c;
  Assigner *local_18;
  
  *in_RDI = in_RSI;
  local_18 = in_RDX;
  Link::Link((Link *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  Link::Link((Link *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_1c = 0;
  while( true ) {
    iVar2 = local_1c;
    iVar1 = Assigner::nblocks(local_18);
    if (iVar1 <= iVar2) break;
    iVar2 = local_1c;
    iVar1 = (*local_18->_vptr_Assigner[3])();
    BlockID::BlockID(&local_24,iVar2,iVar1);
    Link::add_neighbor((Link *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

AllToAllReduce(const Op& op_, const Assigner& assigner):
             op(op_)
    {
      for (int gid = 0; gid < assigner.nblocks(); ++gid)
      {
        BlockID nbr = { gid, assigner.rank(gid) };
        all_neighbors_link.add_neighbor(nbr);
      }
    }